

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

uint8_t * Fossilize::decode_base64(ScratchAllocator *allocator,char *data,size_t length)

{
  char c;
  char c_00;
  char c_01;
  char c_02;
  uint8_t uVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint8_t *puVar8;
  char *pcVar9;
  uint8_t *puVar10;
  uint local_4c;
  uint outbytes;
  uint32_t values;
  char c3;
  char c2;
  char c1;
  char c0;
  uint64_t i;
  uint8_t *puStack_30;
  anon_class_1_0_00000001 base64_index;
  uint8_t *ptr;
  uint8_t *buf;
  size_t length_local;
  char *data_local;
  ScratchAllocator *allocator_local;
  
  puVar8 = (uint8_t *)ScratchAllocator::allocate_raw(allocator,length,0x10);
  _values = 0;
  puStack_30 = puVar8;
  length_local = (size_t)data;
  while( true ) {
    if (length <= _values) {
      return puVar8;
    }
    c = *(char *)length_local;
    if (c == '\0') {
      return puVar8;
    }
    c_00 = *(char *)(length_local + 1);
    if (c_00 == '\0') {
      return puVar8;
    }
    pcVar9 = (char *)(length_local + 3);
    c_01 = *(char *)(length_local + 2);
    if (c_01 == '\0') break;
    length_local = length_local + 4;
    c_02 = *pcVar9;
    if (c_02 == '\0') {
      return puVar8;
    }
    uVar3 = decode_base64::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&i + 7),c);
    uVar4 = decode_base64::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&i + 7),c_00);
    uVar5 = decode_base64::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&i + 7),c_01);
    uVar6 = decode_base64::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&i + 7),c_02);
    uVar7 = uVar3 << 0x12 | uVar4 << 0xc | uVar5 << 6 | uVar6;
    local_4c = 3;
    uVar1 = (uint8_t)(uVar7 >> 0x10);
    if ((c_01 == '=') && (c_02 == '=')) {
      local_4c = 1;
      *puStack_30 = uVar1;
      puStack_30 = puStack_30 + 1;
    }
    else {
      uVar2 = (uint8_t)(uVar7 >> 8);
      if (c_02 == '=') {
        local_4c = 2;
        puVar10 = puStack_30 + 1;
        *puStack_30 = uVar1;
        puStack_30 = puStack_30 + 2;
        *puVar10 = uVar2;
      }
      else {
        *puStack_30 = uVar1;
        puVar10 = puStack_30 + 2;
        puStack_30[1] = uVar2;
        puStack_30 = puStack_30 + 3;
        *puVar10 = (uint8_t)uVar7;
      }
    }
    _values = local_4c + _values;
  }
  return puVar8;
}

Assistant:

static uint8_t *decode_base64(ScratchAllocator &allocator, const char *data, size_t length)
{
	auto *buf = static_cast<uint8_t *>(allocator.allocate_raw(length, 16));
	auto *ptr = buf;

	const auto base64_index = [](char c) -> uint32_t {
		if (c >= 'A' && c <= 'Z')
			return uint32_t(c - 'A');
		else if (c >= 'a' && c <= 'z')
			return uint32_t(c - 'a') + 26;
		else if (c >= '0' && c <= '9')
			return uint32_t(c - '0') + 52;
		else if (c == '+')
			return 62;
		else if (c == '/')
			return 63;
		else
			return 0;
	};

	for (uint64_t i = 0; i < length; )
	{
		char c0 = *data++;
		if (c0 == '\0')
			break;
		char c1 = *data++;
		if (c1 == '\0')
			break;
		char c2 = *data++;
		if (c2 == '\0')
			break;
		char c3 = *data++;
		if (c3 == '\0')
			break;

		uint32_t values =
				(base64_index(c0) << 18) |
				(base64_index(c1) << 12) |
				(base64_index(c2) << 6) |
				(base64_index(c3) << 0);

		unsigned outbytes = 3;
		if (c2 == '=' && c3 == '=')
		{
			outbytes = 1;
			*ptr++ = uint8_t(values >> 16);
		}
		else if (c3 == '=')
		{
			outbytes = 2;
			*ptr++ = uint8_t(values >> 16);
			*ptr++ = uint8_t(values >> 8);
		}
		else
		{
			*ptr++ = uint8_t(values >> 16);
			*ptr++ = uint8_t(values >> 8);
			*ptr++ = uint8_t(values >> 0);
		}

		i += outbytes;
	}

	return buf;
}